

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

errr finish_ui_knowledge_parser(parser *p)

{
  size_t sVar1;
  size_t *p_00;
  char *pcVar2;
  ui_monster_category *src;
  ui_monster_category *tgt;
  size_t count;
  ui_monster_category *cursor;
  ui_knowledge_parse_state *s;
  parser *p_local;
  
  p_00 = (size_t *)parser_priv(p);
  if (p_00 != (size_t *)0x0) {
    tgt = (ui_monster_category *)0x0;
    for (count = *p_00; count != 0; count = *(size_t *)count) {
      tgt = (ui_monster_category *)((long)&tgt->next + 1);
    }
    if (tgt < (ui_monster_category *)0x7fffffff) {
      if (monster_group != (ui_monster_category *)0x0) {
        cleanup_ui_knowledge_parsed_data();
      }
      monster_group = (ui_monster_category *)mem_alloc((long)((long)&tgt->next + 1) * 0x30);
      n_monster_group = (int)tgt + L'\x01';
      monster_group[(long)tgt].next = (ui_monster_category *)0x0;
      pcVar2 = string_make("***Unclassified***");
      monster_group[(long)tgt].name = pcVar2;
      monster_group[(long)tgt].inc_bases = (monster_base **)0x0;
      flag_wipe(monster_group[(long)tgt].inc_flags,0xc);
      monster_group[(long)tgt].n_inc_bases = L'\0';
      monster_group[(long)tgt].max_inc_bases = L'\0';
      count = *p_00;
      while (count != 0) {
        sVar1 = *(size_t *)count;
        tgt = (ui_monster_category *)&tgt[-1].field_0x2f;
        monster_group[(long)tgt].next = monster_group + (long)tgt + 1;
        monster_group[(long)tgt].name = *(char **)(count + 8);
        monster_group[(long)tgt].inc_bases = *(monster_base ***)(count + 0x10);
        flag_copy(monster_group[(long)tgt].inc_flags,(bitflag *)(count + 0x18),0xc);
        monster_group[(long)tgt].n_inc_bases = *(wchar_t *)(count + 0x24);
        monster_group[(long)tgt].max_inc_bases = *(wchar_t *)(count + 0x28);
        mem_free((void *)count);
        count = sVar1;
      }
      mem_free(p_00);
      parser_destroy(p);
      p_local._4_4_ = 0;
    }
    else {
      count = *p_00;
      while (count != 0) {
        sVar1 = *(size_t *)count;
        string_free(*(char **)(count + 8));
        mem_free(*(void **)(count + 0x10));
        mem_free((void *)count);
        count = sVar1;
      }
      mem_free(p_00);
      parser_destroy(p);
      p_local._4_4_ = 0x3b;
    }
    return p_local._4_4_;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                ,0xcfe,"errr finish_ui_knowledge_parser(struct parser *)");
}

Assistant:

static errr finish_ui_knowledge_parser(struct parser *p)
{
	struct ui_knowledge_parse_state *s =
		(struct ui_knowledge_parse_state*) parser_priv(p);
	struct ui_monster_category *cursor;
	size_t count;

	assert(s);

	/* Count the number of categories and allocate a flat array for them. */
	count = 0;
	for (cursor = s->categories; cursor; cursor = cursor->next) {
		++count;
	}
	if (count > INT_MAX - 1) {
		/*
		 * The sorting and display logic for monster groups assumes
		 * the number of categories fits in an int.
		 */
		cursor = s->categories;
		while (cursor) {
			struct ui_monster_category *tgt = cursor;

			cursor = cursor->next;
			string_free((char*) tgt->name);
			mem_free(tgt->inc_bases);
			mem_free(tgt);
		}
		mem_free(s);
		parser_destroy(p);
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}
	if (monster_group) {
		cleanup_ui_knowledge_parsed_data();
	}
	monster_group = mem_alloc((count + 1) * sizeof(*monster_group));
	n_monster_group = (int) (count + 1);

	/* Set the element at the end which receives special treatment. */
	monster_group[count].next = NULL;
	monster_group[count].name = string_make("***Unclassified***");
	monster_group[count].inc_bases = NULL;
	rf_wipe(monster_group[count].inc_flags);
	monster_group[count].n_inc_bases = 0;
	monster_group[count].max_inc_bases = 0;

	/*
	 * Set the others, restoring the order they had in the data file.
	 * Release the memory for the linked list (but not pointed to data
	 * as ownership for that is transferred to the flat array).
	 */
	cursor = s->categories;
	while (cursor) {
		struct ui_monster_category *src = cursor;

		cursor = cursor->next;
		--count;
		monster_group[count].next = monster_group + count + 1;
		monster_group[count].name = src->name;
		monster_group[count].inc_bases = src->inc_bases;
		rf_copy(monster_group[count].inc_flags, src->inc_flags);
		monster_group[count].n_inc_bases = src->n_inc_bases;
		monster_group[count].max_inc_bases = src->max_inc_bases;
		mem_free(src);
	}

	mem_free(s);
	parser_destroy(p);
	return 0;
}